

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined4 uVar11;
  float fVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  bool bVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  ulong uVar24;
  GridSOA *pGVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  ulong *puVar30;
  ulong uVar31;
  GridSOA *pGVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong unaff_R15;
  size_t mask;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_af0;
  undefined8 uStack_ae8;
  ulong local_ad8;
  ulong local_ad0;
  ulong local_ac8;
  ulong *local_ac0;
  GridSOA *local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  RTCFilterFunctionNArguments local_a40;
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  GridSOA **local_980;
  byte local_978;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined1 local_830 [16];
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar75 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar76 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar77 = ZEXT1664(auVar37);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar7 * 0.99999964)));
  auVar78 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar8 * 0.99999964)));
  auVar79 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar9 * 0.99999964)));
  auVar80 = ZEXT1664(auVar37);
  fVar7 = fVar7 * 1.0000004;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = uVar31 ^ 0x10;
  uVar35 = uVar33 ^ 0x10;
  iVar10 = (tray->tnear).field_0.i[k];
  auVar37._4_4_ = iVar10;
  auVar37._0_4_ = iVar10;
  auVar37._8_4_ = iVar10;
  auVar37._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar74._4_4_ = iVar10;
  auVar74._0_4_ = iVar10;
  auVar74._8_4_ = iVar10;
  auVar74._12_4_ = iVar10;
  local_9f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar30 = local_7f8;
  local_ad0 = uVar33;
  local_ac8 = uVar31;
  do {
    local_ac0 = puVar30;
    if (local_ac0 == &local_800) break;
    puVar30 = local_ac0 + -1;
    uVar24 = local_ac0[-1];
    do {
      local_a80 = auVar78._0_16_;
      local_a90 = auVar79._0_16_;
      local_aa0 = auVar80._0_16_;
      local_a50 = auVar75._0_16_;
      local_a60 = auVar76._0_16_;
      local_a70 = auVar77._0_16_;
      if ((uVar24 & 8) == 0) {
        auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar31),local_a50);
        auVar38 = vmulps_avx512vl(local_a80,auVar38);
        auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar33),local_a60);
        auVar39 = vmulps_avx512vl(local_a90,auVar39);
        auVar38 = vmaxps_avx(auVar38,auVar39);
        auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar27),local_a70);
        auVar39 = vmulps_avx512vl(local_aa0,auVar39);
        auVar39 = vmaxps_avx(auVar39,auVar37);
        auVar38 = vmaxps_avx(auVar38,auVar39);
        auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar34),local_a50);
        auVar40._0_4_ = fVar7 * auVar39._0_4_;
        auVar40._4_4_ = fVar7 * auVar39._4_4_;
        auVar40._8_4_ = fVar7 * auVar39._8_4_;
        auVar40._12_4_ = fVar7 * auVar39._12_4_;
        auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar35),local_a60);
        auVar62._0_4_ = fVar8 * auVar39._0_4_;
        auVar62._4_4_ = fVar8 * auVar39._4_4_;
        auVar62._8_4_ = fVar8 * auVar39._8_4_;
        auVar62._12_4_ = fVar8 * auVar39._12_4_;
        auVar39 = vminps_avx(auVar40,auVar62);
        auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar27 ^ 0x10)),local_a70)
        ;
        auVar63._0_4_ = fVar9 * auVar40._0_4_;
        auVar63._4_4_ = fVar9 * auVar40._4_4_;
        auVar63._8_4_ = fVar9 * auVar40._8_4_;
        auVar63._12_4_ = fVar9 * auVar40._12_4_;
        auVar40 = vminps_avx(auVar63,auVar74);
        auVar39 = vminps_avx(auVar39,auVar40);
        uVar21 = vcmpps_avx512vl(auVar38,auVar39,2);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)(byte)uVar21);
      }
      if ((uVar24 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar29 = 4;
        }
        else {
          uVar23 = uVar24 & 0xfffffffffffffff0;
          lVar28 = 0;
          for (uVar24 = unaff_R15; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          uVar29 = 0;
          for (uVar26 = unaff_R15 - 1 & unaff_R15; uVar24 = *(ulong *)(uVar23 + lVar28 * 8),
              uVar26 != 0; uVar26 = uVar26 - 1 & uVar26) {
            *puVar30 = uVar24;
            puVar30 = puVar30 + 1;
            lVar28 = 0;
            for (uVar24 = uVar26; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
          }
        }
      }
      else {
        uVar29 = 6;
      }
    } while (uVar29 == 0);
    if (uVar29 == 6) {
      if (((uint)uVar24 & 0xf) == 8) {
        pGVar25 = (pre->super_Precalculations).grid;
        uVar29 = *(uint *)(pGVar25 + 0xc);
        local_ab0 = (ulong)uVar29;
        uVar16 = *(uint *)(pGVar25 + 0x10);
        local_aa8 = (ulong)uVar16;
        uVar17 = *(uint *)(pGVar25 + 0x24);
        uVar24 = uVar24 >> 4;
        lVar28 = uVar24 * 4 + (ulong)uVar17;
        auVar38 = *(undefined1 (*) [16])(pGVar25 + local_ab0 * 4 + lVar28 + 0x2c);
        auVar39 = auVar38;
        if (2 < local_aa8) {
          auVar39 = *(undefined1 (*) [16])
                     (pGVar25 + local_ab0 * 8 + uVar24 * 4 + (ulong)uVar17 + 0x2c);
        }
        auVar40 = *(undefined1 (*) [16])(pGVar25 + uVar24 * 4 + (ulong)uVar17 + 0x2c);
        if (local_ab0 == 2) {
          auVar40 = vshufps_avx(auVar40,auVar40,0x54);
          auVar38 = vshufps_avx(auVar38,auVar38,0x54);
          auVar39 = vshufps_avx(auVar39,auVar39,0x54);
        }
        uVar31 = (ulong)*(uint *)(pGVar25 + 0x14);
        pGVar32 = pGVar25 + uVar31 * 4 + lVar28 + 0x2c;
        auVar62 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 4);
        auVar63 = auVar62;
        if (2 < uVar16) {
          auVar63 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 8);
        }
        auVar41 = *(undefined1 (*) [16])pGVar32;
        if (uVar29 == 2) {
          auVar41 = vshufps_avx(auVar41,auVar41,0x54);
          auVar62 = vshufps_avx(auVar62,auVar62,0x54);
          auVar63 = vshufps_avx(auVar63,auVar63,0x54);
        }
        pGVar32 = pGVar25 + uVar31 * 8 + lVar28 + 0x2c;
        auVar14 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 4);
        auVar71 = auVar14;
        if (2 < uVar16) {
          auVar71 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 8);
        }
        auVar15 = *(undefined1 (*) [16])pGVar32;
        if (uVar29 == 2) {
          auVar15 = vshufps_avx(auVar15,auVar15,0x54);
          auVar14 = vshufps_avx(auVar14,auVar14,0x54);
          auVar71 = vshufps_avx(auVar71,auVar71,0x54);
        }
        local_ab8 = pGVar25 + uVar31 * 0xc + lVar28 + 0x2c;
        auVar64._16_16_ = auVar38;
        auVar64._0_16_ = auVar40;
        auVar45._16_16_ = auVar39;
        auVar45._0_16_ = auVar38;
        auVar69 = vunpcklps_avx(auVar64,auVar45);
        auVar43 = vshufps_avx(auVar64,auVar64,0xa5);
        auVar46 = vshufps_avx(auVar45,auVar45,0x94);
        auVar44._16_16_ = auVar62;
        auVar44._0_16_ = auVar41;
        auVar72._16_16_ = auVar63;
        auVar72._0_16_ = auVar62;
        auVar64 = vunpcklps_avx(auVar44,auVar72);
        auVar59 = vshufps_avx(auVar44,auVar44,0xa5);
        auVar57 = vshufps_avx(auVar72,auVar72,0x94);
        auVar42._16_16_ = auVar14;
        auVar42._0_16_ = auVar15;
        auVar47._16_16_ = auVar71;
        auVar47._0_16_ = auVar14;
        auVar72 = vunpcklps_avx(auVar42,auVar47);
        auVar45 = vshufps_avx(auVar42,auVar42,0xa5);
        uVar11 = *(undefined4 *)(ray + k * 4);
        auVar48._4_4_ = uVar11;
        auVar48._0_4_ = uVar11;
        auVar48._8_4_ = uVar11;
        auVar48._12_4_ = uVar11;
        auVar48._16_4_ = uVar11;
        auVar48._20_4_ = uVar11;
        auVar48._24_4_ = uVar11;
        auVar48._28_4_ = uVar11;
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar49._4_4_ = uVar11;
        auVar49._0_4_ = uVar11;
        auVar49._8_4_ = uVar11;
        auVar49._12_4_ = uVar11;
        auVar49._16_4_ = uVar11;
        auVar49._20_4_ = uVar11;
        auVar49._24_4_ = uVar11;
        auVar49._28_4_ = uVar11;
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar50._4_4_ = uVar11;
        auVar50._0_4_ = uVar11;
        auVar50._8_4_ = uVar11;
        auVar50._12_4_ = uVar11;
        auVar50._16_4_ = uVar11;
        auVar50._20_4_ = uVar11;
        auVar50._24_4_ = uVar11;
        auVar50._28_4_ = uVar11;
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar66._4_4_ = uVar11;
        auVar66._0_4_ = uVar11;
        auVar66._8_4_ = uVar11;
        auVar66._12_4_ = uVar11;
        auVar66._16_4_ = uVar11;
        auVar66._20_4_ = uVar11;
        auVar66._24_4_ = uVar11;
        auVar66._28_4_ = uVar11;
        auVar42 = vshufps_avx512vl(auVar47,auVar47,0x94);
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar68._4_4_ = uVar11;
        auVar68._0_4_ = uVar11;
        auVar68._8_4_ = uVar11;
        auVar68._12_4_ = uVar11;
        auVar68._16_4_ = uVar11;
        auVar68._20_4_ = uVar11;
        auVar68._24_4_ = uVar11;
        auVar68._28_4_ = uVar11;
        fVar12 = *(float *)(ray + k * 4 + 0x60);
        auVar73._4_4_ = fVar12;
        auVar73._0_4_ = fVar12;
        auVar73._8_4_ = fVar12;
        auVar73._12_4_ = fVar12;
        auVar73._16_4_ = fVar12;
        auVar73._20_4_ = fVar12;
        auVar73._24_4_ = fVar12;
        auVar73._28_4_ = fVar12;
        auVar69 = vsubps_avx(auVar69,auVar48);
        auVar64 = vsubps_avx(auVar64,auVar49);
        auVar72 = vsubps_avx(auVar72,auVar50);
        auVar43 = vsubps_avx512vl(auVar43,auVar48);
        auVar44 = vsubps_avx512vl(auVar59,auVar49);
        auVar45 = vsubps_avx512vl(auVar45,auVar50);
        auVar46 = vsubps_avx512vl(auVar46,auVar48);
        auVar47 = vsubps_avx512vl(auVar57,auVar49);
        auVar42 = vsubps_avx512vl(auVar42,auVar50);
        auVar48 = vsubps_avx512vl(auVar46,auVar69);
        auVar49 = vsubps_avx512vl(auVar47,auVar64);
        auVar50 = vsubps_avx512vl(auVar42,auVar72);
        auVar51 = vsubps_avx512vl(auVar69,auVar43);
        auVar52 = vsubps_avx512vl(auVar64,auVar44);
        auVar53 = vsubps_avx512vl(auVar72,auVar45);
        auVar54 = vsubps_avx512vl(auVar43,auVar46);
        auVar55 = vsubps_avx512vl(auVar44,auVar47);
        auVar56 = vsubps_avx512vl(auVar45,auVar42);
        auVar57 = vaddps_avx512vl(auVar46,auVar69);
        auVar58 = vaddps_avx512vl(auVar47,auVar64);
        auVar59 = vaddps_avx512vl(auVar42,auVar72);
        auVar60 = vmulps_avx512vl(auVar58,auVar50);
        auVar60 = vfmsub231ps_avx512vl(auVar60,auVar49,auVar59);
        auVar59 = vmulps_avx512vl(auVar59,auVar48);
        auVar61 = vfmsub231ps_avx512vl(auVar59,auVar50,auVar57);
        auVar59._4_4_ = auVar57._4_4_ * auVar49._4_4_;
        auVar59._0_4_ = auVar57._0_4_ * auVar49._0_4_;
        auVar59._8_4_ = auVar57._8_4_ * auVar49._8_4_;
        auVar59._12_4_ = auVar57._12_4_ * auVar49._12_4_;
        auVar59._16_4_ = auVar57._16_4_ * auVar49._16_4_;
        auVar59._20_4_ = auVar57._20_4_ * auVar49._20_4_;
        auVar59._24_4_ = auVar57._24_4_ * auVar49._24_4_;
        auVar59._28_4_ = auVar57._28_4_;
        auVar38 = vfmsub231ps_fma(auVar59,auVar48,auVar58);
        auVar58._0_4_ = auVar38._0_4_ * fVar12;
        auVar58._4_4_ = auVar38._4_4_ * fVar12;
        auVar58._8_4_ = auVar38._8_4_ * fVar12;
        auVar58._12_4_ = auVar38._12_4_ * fVar12;
        auVar58._16_4_ = fVar12 * 0.0;
        auVar58._20_4_ = fVar12 * 0.0;
        auVar58._24_4_ = fVar12 * 0.0;
        auVar58._28_4_ = 0;
        auVar59 = vfmadd231ps_avx512vl(auVar58,auVar68,auVar61);
        _local_9e0 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar60);
        auVar59 = vaddps_avx512vl(auVar69,auVar43);
        auVar57 = vaddps_avx512vl(auVar64,auVar44);
        auVar58 = vaddps_avx512vl(auVar72,auVar45);
        auVar60 = vmulps_avx512vl(auVar57,auVar53);
        auVar60 = vfmsub231ps_avx512vl(auVar60,auVar52,auVar58);
        auVar58 = vmulps_avx512vl(auVar58,auVar51);
        auVar58 = vfmsub231ps_avx512vl(auVar58,auVar53,auVar59);
        auVar59 = vmulps_avx512vl(auVar59,auVar52);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar51,auVar57);
        auVar57._4_4_ = auVar59._4_4_ * fVar12;
        auVar57._0_4_ = auVar59._0_4_ * fVar12;
        auVar57._8_4_ = auVar59._8_4_ * fVar12;
        auVar57._12_4_ = auVar59._12_4_ * fVar12;
        auVar57._16_4_ = auVar59._16_4_ * fVar12;
        auVar57._20_4_ = auVar59._20_4_ * fVar12;
        auVar57._24_4_ = auVar59._24_4_ * fVar12;
        auVar57._28_4_ = auVar59._28_4_;
        auVar59 = vfmadd231ps_avx512vl(auVar57,auVar68,auVar58);
        _local_9c0 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar60);
        auVar43 = vaddps_avx512vl(auVar43,auVar46);
        auVar46 = vaddps_avx512vl(auVar44,auVar47);
        auVar59 = vaddps_avx512vl(auVar45,auVar42);
        auVar57 = vmulps_avx512vl(auVar46,auVar56);
        auVar57 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar59);
        auVar59 = vmulps_avx512vl(auVar59,auVar54);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar56,auVar43);
        auVar43 = vmulps_avx512vl(auVar43,auVar55);
        auVar43 = vfmsub231ps_avx512vl(auVar43,auVar54,auVar46);
        auVar43 = vmulps_avx512vl(auVar43,auVar73);
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar68,auVar59);
        auVar59 = vfmadd231ps_avx512vl(auVar43,auVar66,auVar57);
        auVar43 = vaddps_avx512vl(_local_9e0,_local_9c0);
        local_9a0 = vaddps_avx512vl(auVar59,auVar43);
        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(local_9a0,auVar57);
        auVar43._8_4_ = 0x34000000;
        auVar43._0_8_ = 0x3400000034000000;
        auVar43._12_4_ = 0x34000000;
        auVar43._16_4_ = 0x34000000;
        auVar43._20_4_ = 0x34000000;
        auVar43._24_4_ = 0x34000000;
        auVar43._28_4_ = 0x34000000;
        auVar43 = vmulps_avx512vl(auVar57,auVar43);
        auVar46 = vminps_avx512vl(_local_9e0,_local_9c0);
        auVar45 = vminps_avx512vl(auVar46,auVar59);
        auVar46._8_4_ = 0x80000000;
        auVar46._0_8_ = 0x8000000080000000;
        auVar46._12_4_ = 0x80000000;
        auVar46._16_4_ = 0x80000000;
        auVar46._20_4_ = 0x80000000;
        auVar46._24_4_ = 0x80000000;
        auVar46._28_4_ = 0x80000000;
        auVar46 = vxorps_avx512vl(auVar43,auVar46);
        uVar21 = vcmpps_avx512vl(auVar45,auVar46,5);
        auVar46 = vmaxps_avx512vl(_local_9e0,_local_9c0);
        auVar46 = vmaxps_avx512vl(auVar46,auVar59);
        uVar22 = vcmpps_avx512vl(auVar46,auVar43,2);
        local_978 = (byte)uVar21 | (byte)uVar22;
        if (local_978 == 0) {
LAB_0078bb97:
          bVar36 = false;
        }
        else {
          auVar43 = vmulps_avx512vl(auVar52,auVar50);
          auVar46 = vmulps_avx512vl(auVar48,auVar53);
          auVar59 = vmulps_avx512vl(auVar51,auVar49);
          auVar45 = vmulps_avx512vl(auVar55,auVar53);
          auVar42 = vmulps_avx512vl(auVar51,auVar56);
          auVar44 = vmulps_avx512vl(auVar54,auVar52);
          auVar47 = vfmsub213ps_avx512vl(auVar49,auVar53,auVar43);
          auVar49 = vfmsub213ps_avx512vl(auVar50,auVar51,auVar46);
          auVar48 = vfmsub213ps_avx512vl(auVar48,auVar52,auVar59);
          auVar50 = vfmsub213ps_avx512vl(auVar56,auVar52,auVar45);
          auVar52 = vfmsub213ps_avx512vl(auVar54,auVar53,auVar42);
          auVar51 = vfmsub213ps_avx512vl(auVar55,auVar51,auVar44);
          vandps_avx512vl(auVar43,auVar57);
          vandps_avx512vl(auVar45,auVar57);
          uVar31 = vcmpps_avx512vl(auVar51,auVar51,1);
          vandps_avx512vl(auVar46,auVar57);
          vandps_avx512vl(auVar42,auVar57);
          uVar33 = vcmpps_avx512vl(auVar51,auVar51,1);
          vandps_avx512vl(auVar59,auVar57);
          vandps_avx512vl(auVar44,auVar57);
          uVar24 = vcmpps_avx512vl(auVar51,auVar51,1);
          bVar36 = (bool)((byte)uVar31 & 1);
          local_900._0_4_ = (uint)bVar36 * auVar47._0_4_ | (uint)!bVar36 * auVar50._0_4_;
          bVar36 = (bool)((byte)(uVar31 >> 1) & 1);
          local_900._4_4_ = (uint)bVar36 * auVar47._4_4_ | (uint)!bVar36 * auVar50._4_4_;
          bVar36 = (bool)((byte)(uVar31 >> 2) & 1);
          local_900._8_4_ = (uint)bVar36 * auVar47._8_4_ | (uint)!bVar36 * auVar50._8_4_;
          bVar36 = (bool)((byte)(uVar31 >> 3) & 1);
          local_900._12_4_ = (uint)bVar36 * auVar47._12_4_ | (uint)!bVar36 * auVar50._12_4_;
          bVar36 = (bool)((byte)(uVar31 >> 4) & 1);
          local_900._16_4_ = (uint)bVar36 * auVar47._16_4_ | (uint)!bVar36 * auVar50._16_4_;
          bVar36 = (bool)((byte)(uVar31 >> 5) & 1);
          local_900._20_4_ = (uint)bVar36 * auVar47._20_4_ | (uint)!bVar36 * auVar50._20_4_;
          bVar36 = (bool)((byte)(uVar31 >> 6) & 1);
          local_900._24_4_ = (uint)bVar36 * auVar47._24_4_ | (uint)!bVar36 * auVar50._24_4_;
          bVar36 = SUB81(uVar31 >> 7,0);
          local_900._28_4_ = (uint)bVar36 * auVar47._28_4_ | (uint)!bVar36 * auVar50._28_4_;
          bVar36 = (bool)((byte)uVar33 & 1);
          local_8e0._0_4_ = (uint)bVar36 * auVar49._0_4_ | (uint)!bVar36 * auVar52._0_4_;
          bVar36 = (bool)((byte)(uVar33 >> 1) & 1);
          local_8e0._4_4_ = (uint)bVar36 * auVar49._4_4_ | (uint)!bVar36 * auVar52._4_4_;
          bVar36 = (bool)((byte)(uVar33 >> 2) & 1);
          local_8e0._8_4_ = (uint)bVar36 * auVar49._8_4_ | (uint)!bVar36 * auVar52._8_4_;
          bVar36 = (bool)((byte)(uVar33 >> 3) & 1);
          local_8e0._12_4_ = (uint)bVar36 * auVar49._12_4_ | (uint)!bVar36 * auVar52._12_4_;
          bVar36 = (bool)((byte)(uVar33 >> 4) & 1);
          local_8e0._16_4_ = (uint)bVar36 * auVar49._16_4_ | (uint)!bVar36 * auVar52._16_4_;
          bVar36 = (bool)((byte)(uVar33 >> 5) & 1);
          local_8e0._20_4_ = (uint)bVar36 * auVar49._20_4_ | (uint)!bVar36 * auVar52._20_4_;
          bVar36 = (bool)((byte)(uVar33 >> 6) & 1);
          local_8e0._24_4_ = (uint)bVar36 * auVar49._24_4_ | (uint)!bVar36 * auVar52._24_4_;
          bVar36 = SUB81(uVar33 >> 7,0);
          local_8e0._28_4_ = (uint)bVar36 * auVar49._28_4_ | (uint)!bVar36 * auVar52._28_4_;
          bVar36 = (bool)((byte)uVar24 & 1);
          local_8c0._0_4_ = (float)((uint)bVar36 * auVar48._0_4_ | (uint)!bVar36 * auVar51._0_4_);
          bVar36 = (bool)((byte)(uVar24 >> 1) & 1);
          local_8c0._4_4_ = (float)((uint)bVar36 * auVar48._4_4_ | (uint)!bVar36 * auVar51._4_4_);
          bVar36 = (bool)((byte)(uVar24 >> 2) & 1);
          local_8c0._8_4_ = (float)((uint)bVar36 * auVar48._8_4_ | (uint)!bVar36 * auVar51._8_4_);
          bVar36 = (bool)((byte)(uVar24 >> 3) & 1);
          local_8c0._12_4_ = (float)((uint)bVar36 * auVar48._12_4_ | (uint)!bVar36 * auVar51._12_4_)
          ;
          bVar36 = (bool)((byte)(uVar24 >> 4) & 1);
          local_8c0._16_4_ = (float)((uint)bVar36 * auVar48._16_4_ | (uint)!bVar36 * auVar51._16_4_)
          ;
          bVar36 = (bool)((byte)(uVar24 >> 5) & 1);
          local_8c0._20_4_ = (float)((uint)bVar36 * auVar48._20_4_ | (uint)!bVar36 * auVar51._20_4_)
          ;
          bVar36 = (bool)((byte)(uVar24 >> 6) & 1);
          local_8c0._24_4_ = (float)((uint)bVar36 * auVar48._24_4_ | (uint)!bVar36 * auVar51._24_4_)
          ;
          bVar36 = SUB81(uVar24 >> 7,0);
          local_8c0._28_4_ = (uint)bVar36 * auVar48._28_4_ | (uint)!bVar36 * auVar51._28_4_;
          auVar53._4_4_ = fVar12 * local_8c0._4_4_;
          auVar53._0_4_ = fVar12 * local_8c0._0_4_;
          auVar53._8_4_ = fVar12 * local_8c0._8_4_;
          auVar53._12_4_ = fVar12 * local_8c0._12_4_;
          auVar53._16_4_ = fVar12 * local_8c0._16_4_;
          auVar53._20_4_ = fVar12 * local_8c0._20_4_;
          auVar53._24_4_ = fVar12 * local_8c0._24_4_;
          auVar53._28_4_ = fVar12;
          auVar38 = vfmadd213ps_fma(auVar68,local_8e0,auVar53);
          auVar38 = vfmadd213ps_fma(auVar66,local_900,ZEXT1632(auVar38));
          auVar59 = ZEXT1632(CONCAT412(auVar38._12_4_ + auVar38._12_4_,
                                       CONCAT48(auVar38._8_4_ + auVar38._8_4_,
                                                CONCAT44(auVar38._4_4_ + auVar38._4_4_,
                                                         auVar38._0_4_ + auVar38._0_4_))));
          auVar54._0_4_ = auVar72._0_4_ * local_8c0._0_4_;
          auVar54._4_4_ = auVar72._4_4_ * local_8c0._4_4_;
          auVar54._8_4_ = auVar72._8_4_ * local_8c0._8_4_;
          auVar54._12_4_ = auVar72._12_4_ * local_8c0._12_4_;
          auVar54._16_4_ = auVar72._16_4_ * local_8c0._16_4_;
          auVar54._20_4_ = auVar72._20_4_ * local_8c0._20_4_;
          auVar54._24_4_ = auVar72._24_4_ * local_8c0._24_4_;
          auVar54._28_4_ = 0;
          auVar38 = vfmadd213ps_fma(auVar64,local_8e0,auVar54);
          auVar39 = vfmadd213ps_fma(auVar69,local_900,ZEXT1632(auVar38));
          auVar43 = vrcp14ps_avx512vl(auVar59);
          auVar69._8_4_ = 0x3f800000;
          auVar69._0_8_ = &DAT_3f8000003f800000;
          auVar69._12_4_ = 0x3f800000;
          auVar69._16_4_ = 0x3f800000;
          auVar69._20_4_ = 0x3f800000;
          auVar69._24_4_ = 0x3f800000;
          auVar69._28_4_ = 0x3f800000;
          auVar46 = vfnmadd213ps_avx512vl(auVar43,auVar59,auVar69);
          auVar38 = vfmadd132ps_fma(auVar46,auVar43,auVar43);
          local_920 = ZEXT1632(CONCAT412((auVar39._12_4_ + auVar39._12_4_) * auVar38._12_4_,
                                         CONCAT48((auVar39._8_4_ + auVar39._8_4_) * auVar38._8_4_,
                                                  CONCAT44((auVar39._4_4_ + auVar39._4_4_) *
                                                           auVar38._4_4_,
                                                           (auVar39._0_4_ + auVar39._0_4_) *
                                                           auVar38._0_4_))));
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar51._4_4_ = uVar11;
          auVar51._0_4_ = uVar11;
          auVar51._8_4_ = uVar11;
          auVar51._12_4_ = uVar11;
          auVar51._16_4_ = uVar11;
          auVar51._20_4_ = uVar11;
          auVar51._24_4_ = uVar11;
          auVar51._28_4_ = uVar11;
          uVar21 = vcmpps_avx512vl(local_920,auVar51,0xd);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar52._4_4_ = uVar11;
          auVar52._0_4_ = uVar11;
          auVar52._8_4_ = uVar11;
          auVar52._12_4_ = uVar11;
          auVar52._16_4_ = uVar11;
          auVar52._20_4_ = uVar11;
          auVar52._24_4_ = uVar11;
          auVar52._28_4_ = uVar11;
          uVar22 = vcmpps_avx512vl(local_920,auVar52,2);
          local_978 = (byte)uVar21 & (byte)uVar22 & local_978;
          if (local_978 == 0) goto LAB_0078bb97;
          uVar21 = vcmpps_avx512vl(auVar59,ZEXT832(0) << 0x20,4);
          local_978 = local_978 & (byte)uVar21;
          if (local_978 == 0) {
LAB_0078badc:
            bVar36 = false;
          }
          else {
            local_980 = &local_ab8;
            pGVar18 = (context->scene->geometries).items[*(uint *)(pGVar25 + 0x18)].ptr;
            if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0078badc;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar36 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              vandps_avx512vl(local_9a0,auVar57);
              auVar55._8_4_ = 0x219392ef;
              auVar55._0_8_ = 0x219392ef219392ef;
              auVar55._12_4_ = 0x219392ef;
              auVar55._16_4_ = 0x219392ef;
              auVar55._20_4_ = 0x219392ef;
              auVar55._24_4_ = 0x219392ef;
              auVar55._28_4_ = 0x219392ef;
              uVar31 = vcmpps_avx512vl(local_9a0,auVar55,5);
              auVar43 = vrcp14ps_avx512vl(local_9a0);
              auVar61._8_4_ = 0x3f800000;
              auVar61._0_8_ = &DAT_3f8000003f800000;
              auVar61._12_4_ = 0x3f800000;
              auVar61._16_4_ = 0x3f800000;
              auVar61._20_4_ = 0x3f800000;
              auVar61._24_4_ = 0x3f800000;
              auVar61._28_4_ = 0x3f800000;
              auVar38 = vfnmadd213ps_fma(local_9a0,auVar43,auVar61);
              auVar46 = vfmadd132ps_avx512vl(ZEXT1632(auVar38),auVar43,auVar43);
              fVar1 = (float)((uint)((byte)uVar31 & 1) * auVar46._0_4_);
              fVar2 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar46._4_4_);
              fVar3 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar46._8_4_);
              fVar4 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar46._12_4_);
              fVar5 = (float)((uint)((byte)(uVar31 >> 4) & 1) * auVar46._16_4_);
              fVar6 = (float)((uint)((byte)(uVar31 >> 5) & 1) * auVar46._20_4_);
              fVar12 = (float)((uint)((byte)(uVar31 >> 6) & 1) * auVar46._24_4_);
              auVar56._4_4_ = fVar2 * (float)local_9e0._4_4_;
              auVar56._0_4_ = fVar1 * (float)local_9e0._0_4_;
              auVar56._8_4_ = fVar3 * fStack_9d8;
              auVar56._12_4_ = fVar4 * fStack_9d4;
              auVar56._16_4_ = fVar5 * fStack_9d0;
              auVar56._20_4_ = fVar6 * fStack_9cc;
              auVar56._24_4_ = fVar12 * fStack_9c8;
              auVar56._28_4_ = auVar43._28_4_;
              auVar43 = vminps_avx(auVar56,auVar61);
              auVar60._4_4_ = fVar2 * (float)local_9c0._4_4_;
              auVar60._0_4_ = fVar1 * (float)local_9c0._0_4_;
              auVar60._8_4_ = fVar3 * fStack_9b8;
              auVar60._12_4_ = fVar4 * fStack_9b4;
              auVar60._16_4_ = fVar5 * fStack_9b0;
              auVar60._20_4_ = fVar6 * fStack_9ac;
              auVar60._24_4_ = fVar12 * fStack_9a8;
              auVar60._28_4_ = (uint)(byte)(uVar31 >> 7) * auVar46._28_4_;
              auVar46 = vminps_avx(auVar60,auVar61);
              auVar38 = *(undefined1 (*) [16])(local_ab8 + local_ab0 * 4);
              auVar39 = auVar38;
              if (2 < local_aa8) {
                auVar39 = *(undefined1 (*) [16])(local_ab8 + local_ab0 * 8);
              }
              auVar40 = *(undefined1 (*) [16])local_ab8;
              if (local_ab0 == 2) {
                auVar40 = vpshufd_avx(auVar40,0x54);
                auVar38 = vpshufd_avx(auVar38,0x54);
                auVar39 = vpshufd_avx(auVar39,0x54);
              }
              auVar67._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar40;
              auVar67._16_16_ = ZEXT116(1) * auVar38;
              auVar65._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar38;
              auVar65._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39
              ;
              auVar59 = vpunpckldq_avx2(auVar67,auVar65);
              auVar45 = vpshufd_avx2(auVar67,0xa5);
              auVar64 = vpshufd_avx2(auVar65,0x94);
              auVar57 = vpsrld_avx2(auVar59,0x10);
              auVar59 = vpblendw_avx2(auVar59,ZEXT832(0) << 0x20,0xaa);
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar57 = vcvtdq2ps_avx(auVar57);
              auVar69 = vpsrld_avx2(auVar45,0x10);
              auVar45 = vpblendw_avx2(auVar45,ZEXT832(0) << 0x20,0xaa);
              auVar45 = vcvtdq2ps_avx(auVar45);
              auVar69 = vcvtdq2ps_avx(auVar69);
              auVar72 = vpsrld_avx2(auVar64,0x10);
              auVar64 = vpblendw_avx2(auVar64,ZEXT832(0) << 0x20,0xaa);
              auVar64 = vcvtdq2ps_avx(auVar64);
              auVar72 = vcvtdq2ps_avx(auVar72);
              auVar70._8_4_ = 0x3f800000;
              auVar70._0_8_ = &DAT_3f8000003f800000;
              auVar70._12_4_ = 0x3f800000;
              auVar70._16_4_ = 0x3f800000;
              auVar70._20_4_ = 0x3f800000;
              auVar70._24_4_ = 0x3f800000;
              auVar70._28_4_ = 0x3f800000;
              auVar42 = vsubps_avx(auVar70,auVar43);
              auVar42 = vsubps_avx(auVar42,auVar46);
              local_960._0_4_ =
                   auVar46._0_4_ * auVar64._0_4_ * 0.00012207031 +
                   auVar43._0_4_ * auVar45._0_4_ * 0.00012207031 +
                   auVar42._0_4_ * auVar59._0_4_ * 0.00012207031;
              local_960._4_4_ =
                   auVar46._4_4_ * auVar64._4_4_ * 0.00012207031 +
                   auVar43._4_4_ * auVar45._4_4_ * 0.00012207031 +
                   auVar42._4_4_ * auVar59._4_4_ * 0.00012207031;
              local_960._8_4_ =
                   auVar46._8_4_ * auVar64._8_4_ * 0.00012207031 +
                   auVar43._8_4_ * auVar45._8_4_ * 0.00012207031 +
                   auVar42._8_4_ * auVar59._8_4_ * 0.00012207031;
              local_960._12_4_ =
                   auVar46._12_4_ * auVar64._12_4_ * 0.00012207031 +
                   auVar43._12_4_ * auVar45._12_4_ * 0.00012207031 +
                   auVar42._12_4_ * auVar59._12_4_ * 0.00012207031;
              local_960._16_4_ =
                   auVar46._16_4_ * auVar64._16_4_ * 0.00012207031 +
                   auVar43._16_4_ * auVar45._16_4_ * 0.00012207031 +
                   auVar42._16_4_ * auVar59._16_4_ * 0.00012207031;
              local_960._20_4_ =
                   auVar46._20_4_ * auVar64._20_4_ * 0.00012207031 +
                   auVar43._20_4_ * auVar45._20_4_ * 0.00012207031 +
                   auVar42._20_4_ * auVar59._20_4_ * 0.00012207031;
              local_960._24_4_ =
                   auVar46._24_4_ * auVar64._24_4_ * 0.00012207031 +
                   auVar43._24_4_ * auVar45._24_4_ * 0.00012207031 +
                   auVar42._24_4_ * auVar59._24_4_ * 0.00012207031;
              local_960._28_4_ = auVar64._28_4_ + auVar45._28_4_ + auVar46._28_4_;
              local_940._0_4_ =
                   auVar46._0_4_ * auVar72._0_4_ * 0.00012207031 +
                   auVar43._0_4_ * auVar69._0_4_ * 0.00012207031 +
                   auVar42._0_4_ * auVar57._0_4_ * 0.00012207031;
              local_940._4_4_ =
                   auVar46._4_4_ * auVar72._4_4_ * 0.00012207031 +
                   auVar43._4_4_ * auVar69._4_4_ * 0.00012207031 +
                   auVar42._4_4_ * auVar57._4_4_ * 0.00012207031;
              local_940._8_4_ =
                   auVar46._8_4_ * auVar72._8_4_ * 0.00012207031 +
                   auVar43._8_4_ * auVar69._8_4_ * 0.00012207031 +
                   auVar42._8_4_ * auVar57._8_4_ * 0.00012207031;
              local_940._12_4_ =
                   auVar46._12_4_ * auVar72._12_4_ * 0.00012207031 +
                   auVar43._12_4_ * auVar69._12_4_ * 0.00012207031 +
                   auVar42._12_4_ * auVar57._12_4_ * 0.00012207031;
              local_940._16_4_ =
                   auVar46._16_4_ * auVar72._16_4_ * 0.00012207031 +
                   auVar43._16_4_ * auVar69._16_4_ * 0.00012207031 +
                   auVar42._16_4_ * auVar57._16_4_ * 0.00012207031;
              local_940._20_4_ =
                   auVar46._20_4_ * auVar72._20_4_ * 0.00012207031 +
                   auVar43._20_4_ * auVar69._20_4_ * 0.00012207031 +
                   auVar42._20_4_ * auVar57._20_4_ * 0.00012207031;
              local_940._24_4_ =
                   auVar46._24_4_ * auVar72._24_4_ * 0.00012207031 +
                   auVar43._24_4_ * auVar69._24_4_ * 0.00012207031 +
                   auVar42._24_4_ * auVar57._24_4_ * 0.00012207031;
              local_940._28_4_ = auVar45._28_4_ + auVar69._28_4_ + auVar42._28_4_;
              local_ad8 = (ulong)local_978;
              bVar36 = local_ad8 != 0;
              if (bVar36) {
                uVar31 = 0;
                for (uVar33 = local_ad8; (uVar33 & 1) == 0;
                    uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                  uVar31 = uVar31 + 1;
                }
                local_a00 = vpbroadcastd_avx512vl();
                local_a10 = vpbroadcastd_avx512vl();
                do {
                  uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar13 = *(undefined4 *)(local_960 + uVar31 * 4);
                  local_860._4_4_ = uVar13;
                  local_860._0_4_ = uVar13;
                  local_860._8_4_ = uVar13;
                  local_860._12_4_ = uVar13;
                  uVar13 = *(undefined4 *)(local_940 + uVar31 * 4);
                  local_850._4_4_ = uVar13;
                  local_850._0_4_ = uVar13;
                  local_850._8_4_ = uVar13;
                  local_850._12_4_ = uVar13;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_920 + uVar31 * 4);
                  local_a40.context = context->user;
                  local_890 = *(undefined4 *)(local_900 + uVar31 * 4);
                  uVar13 = *(undefined4 *)(local_8e0 + uVar31 * 4);
                  local_880._4_4_ = uVar13;
                  local_880._0_4_ = uVar13;
                  local_880._8_4_ = uVar13;
                  local_880._12_4_ = uVar13;
                  uVar13 = *(undefined4 *)(local_8c0 + uVar31 * 4);
                  local_870._4_4_ = uVar13;
                  local_870._0_4_ = uVar13;
                  local_870._8_4_ = uVar13;
                  local_870._12_4_ = uVar13;
                  uStack_88c = local_890;
                  uStack_888 = local_890;
                  uStack_884 = local_890;
                  local_840 = local_a10._0_8_;
                  uStack_838 = local_a10._8_8_;
                  local_830 = local_a00;
                  vpcmpeqd_avx2(ZEXT1632(local_a00),ZEXT1632(local_a00));
                  uStack_81c = (local_a40.context)->instID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = (local_a40.context)->instPrimID[0];
                  uStack_80c = uStack_810;
                  uStack_808 = uStack_810;
                  uStack_804 = uStack_810;
                  local_af0 = local_9f0._0_8_;
                  uStack_ae8 = local_9f0._8_8_;
                  local_a40.valid = (int *)&local_af0;
                  local_a40.geometryUserPtr = pGVar18->userPtr;
                  local_a40.hit = (RTCHitN *)&local_890;
                  local_a40.N = 4;
                  local_a40.ray = (RTCRayN *)ray;
                  if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar18->occlusionFilterN)(&local_a40);
                  }
                  auVar38._8_8_ = uStack_ae8;
                  auVar38._0_8_ = local_af0;
                  uVar33 = vptestmd_avx512vl(auVar38,auVar38);
                  if ((uVar33 & 0xf) != 0) {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var19)(&local_a40);
                    }
                    auVar39._8_8_ = uStack_ae8;
                    auVar39._0_8_ = local_af0;
                    uVar33 = vptestmd_avx512vl(auVar39,auVar39);
                    uVar33 = uVar33 & 0xf;
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar20 = (bool)((byte)uVar33 & 1);
                    auVar41._0_4_ =
                         (uint)bVar20 * auVar38._0_4_ |
                         (uint)!bVar20 * *(int *)(local_a40.ray + 0x80);
                    bVar20 = (bool)((byte)(uVar33 >> 1) & 1);
                    auVar41._4_4_ =
                         (uint)bVar20 * auVar38._4_4_ |
                         (uint)!bVar20 * *(int *)(local_a40.ray + 0x84);
                    bVar20 = (bool)((byte)(uVar33 >> 2) & 1);
                    auVar41._8_4_ =
                         (uint)bVar20 * auVar38._8_4_ |
                         (uint)!bVar20 * *(int *)(local_a40.ray + 0x88);
                    bVar20 = SUB81(uVar33 >> 3,0);
                    auVar41._12_4_ =
                         (uint)bVar20 * auVar38._12_4_ |
                         (uint)!bVar20 * *(int *)(local_a40.ray + 0x8c);
                    *(undefined1 (*) [16])(local_a40.ray + 0x80) = auVar41;
                    if ((byte)uVar33 != 0) {
                      auVar75 = ZEXT1664(local_a50);
                      auVar76 = ZEXT1664(local_a60);
                      auVar77 = ZEXT1664(local_a70);
                      auVar78 = ZEXT1664(local_a80);
                      auVar79 = ZEXT1664(local_a90);
                      auVar80 = ZEXT1664(local_aa0);
                      break;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar11;
                  uVar33 = uVar31 & 0x3f;
                  uVar31 = 0;
                  local_ad8 = local_ad8 ^ 1L << uVar33;
                  for (uVar33 = local_ad8; (uVar33 & 1) == 0;
                      uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                    uVar31 = uVar31 + 1;
                  }
                  bVar36 = local_ad8 != 0;
                  auVar75 = ZEXT1664(local_a50);
                  auVar76 = ZEXT1664(local_a60);
                  auVar77 = ZEXT1664(local_a70);
                  auVar78 = ZEXT1664(local_a80);
                  auVar79 = ZEXT1664(local_a90);
                  auVar80 = ZEXT1664(local_aa0);
                } while (bVar36);
              }
            }
          }
        }
        uVar24 = 0;
        uVar31 = local_ac8;
        uVar33 = local_ad0;
      }
      else {
        pGVar25 = (GridSOA *)(uVar24 & 0xfffffffffffffff0);
        uVar24 = *(ulong *)(pGVar25 + (ulong)*(uint *)(pGVar25 + 0x2c) + 0x30);
        (pre->super_Precalculations).grid = pGVar25;
        bVar36 = false;
      }
      if (bVar36) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar29 = 1;
      }
      else {
        uVar29 = 0;
        if (uVar24 != 0) {
          *puVar30 = uVar24;
          puVar30 = puVar30 + 1;
        }
      }
    }
  } while ((uVar29 & 3) == 0);
  return local_ac0 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }